

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::verifyReadBuffer
          (FunctionalTest13 *this,uint n_fs_id,uint n_fs_subroutine,uint n_gs_id,
          uint n_gs_subroutine,uint n_tc_id,uint n_tc_subroutine,uint n_te_id,uint n_te_subroutine,
          uint n_vs_id,uint n_vs_subroutine)

{
  ostringstream *this_00;
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  auVar10._0_4_ =
       ((float)(n_fs_id + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(n_fs_id + 1 & 0xffff | 0x4b000000);
  auVar10._4_4_ =
       ((float)(n_fs_id + 2 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(n_fs_id + 2 & 0xffff | 0x4b000000);
  auVar10._8_4_ =
       ((float)(n_fs_id + 3 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(n_fs_id + 3 & 0xffff | 0x4b000000);
  auVar10._12_4_ =
       ((float)(n_fs_id + 4 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(n_fs_id + 4 & 0xffff | 0x4b000000);
  if (n_fs_subroutine == 0) {
    auVar10 = divps(auVar10,_DAT_01a2bfa0);
  }
  else {
    auVar10 = divps(auVar10,_DAT_01a2bfb0);
  }
  uVar3 = this->m_to_height;
  if (uVar3 != 0) {
    fVar12 = (float)(n_vs_id + 1) * *(float *)(&DAT_01a572a8 + (ulong)(n_vs_subroutine == 0) * 4) +
             auVar10._0_4_ + 0.0 + 0.0 + 0.0;
    fVar13 = (float)(n_tc_id + 1) * *(float *)(&DAT_01a57298 + (ulong)(n_tc_subroutine == 0) * 4) +
             auVar10._4_4_ + 0.0 + 0.0 + 0.0;
    fVar14 = (float)(n_te_id + 1) * *(float *)(&DAT_01a572a0 + (ulong)(n_te_subroutine == 0) * 4) +
             auVar10._8_4_ + 0.0 + 0.0 + 0.0;
    fVar15 = auVar10._12_4_ +
             (float)(n_gs_id + 1) * *(float *)(&DAT_01a57290 + (ulong)(n_gs_subroutine == 0) * 4) +
             0.0 + 0.0 + 0.0;
    this_00 = (ostringstream *)(local_1b0 + 8);
    uVar4 = this->m_to_width;
    bVar2 = true;
    uVar7 = 0;
    do {
      if ((bool)(uVar4 != 0 & bVar2)) {
        iVar6 = uVar4 * (int)uVar7;
        puVar1 = this->m_read_buffer;
        uVar3 = 0;
        uVar8 = 0;
        while( true ) {
          uVar5 = (ulong)uVar3;
          fVar9 = *(float *)(puVar1 + uVar5 * 4 + (ulong)(uint)(iVar6 * 4) * 4) - fVar12;
          fVar11 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar11 = fVar9;
          }
          if (1e-05 < fVar11) break;
          fVar9 = *(float *)(puVar1 + uVar5 * 4 + (ulong)(uint)(iVar6 * 4) * 4 + 4) - fVar13;
          fVar11 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar11 = fVar9;
          }
          if (1e-05 < fVar11) break;
          fVar9 = *(float *)(puVar1 + uVar5 * 4 + (ulong)(uint)(iVar6 * 4) * 4 + 8) - fVar14;
          fVar11 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar11 = fVar9;
          }
          if (1e-05 < fVar11) break;
          fVar9 = *(float *)(puVar1 + uVar5 * 4 + (ulong)(uint)(iVar6 * 4) * 4 + 0xc) - fVar15;
          fVar11 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar11 = fVar9;
          }
          if (1e-05 < fVar11) break;
          uVar8 = uVar8 + 1;
          if ((uVar4 <= uVar8) || (uVar3 = uVar3 + 4, !bVar2)) goto LAB_00976fd3;
        }
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Invalid texel rendered at (",0x1b);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,") for the following configuration: n_fs_id:",0x2b);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," n_fs_subroutine:",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," n_gs_id:",9);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," n_gs_subroutine:",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," n_tc_id:",9);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," n_tc_subroutine:",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," n_te_id:",9);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," n_te_subroutine:",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," n_vs_id:",9);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," n_vs_subroutine:",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; expected:(",0xc);
        std::ostream::_M_insert<double>((double)fVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)fVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)fVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)fVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"), found:(",10);
        std::ostream::_M_insert<double>
                  ((double)*(float *)(puVar1 + uVar5 * 4 + (ulong)(uint)(iVar6 * 4) * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>
                  ((double)*(float *)(puVar1 + uVar5 * 4 + (ulong)(uint)(iVar6 * 4) * 4 + 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>
                  ((double)*(float *)(puVar1 + uVar5 * 4 + (ulong)(uint)(iVar6 * 4) * 4 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>
                  ((double)*(float *)(puVar1 + uVar5 * 4 + (ulong)(uint)(iVar6 * 4) * 4 + 0xc));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,").",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
        uVar4 = this->m_to_width;
        bVar2 = false;
LAB_00976fd3:
        uVar3 = this->m_to_height;
      }
      uVar7 = uVar7 + 1;
    } while ((uVar7 < uVar3) && (bVar2));
  }
  return;
}

Assistant:

void FunctionalTest13::verifyReadBuffer(unsigned int n_fs_id, unsigned int n_fs_subroutine, unsigned int n_gs_id,
										unsigned int n_gs_subroutine, unsigned int n_tc_id,
										unsigned int n_tc_subroutine, unsigned int n_te_id,
										unsigned int n_te_subroutine, unsigned int n_vs_id,
										unsigned int n_vs_subroutine)
{
	float expected_color[4] = { 0 };
	float fs_modifier[4]	= { 0 };
	float gs_modifier[4]	= { 0 };
	float tc_modifier[4]	= { 0 };
	float te_modifier[4]	= { 0 };
	float vs_modifier[4]	= { 0 };

	if (n_fs_subroutine == 0)
	{
		for (unsigned int n_component = 0; n_component < 4; ++n_component)
		{
			fs_modifier[n_component] = float(n_fs_id + n_component + 1) / 10.0f;
		}
	}
	else
	{
		for (unsigned int n_component = 0; n_component < 4; ++n_component)
		{
			fs_modifier[n_component] = float(n_fs_id + n_component + 1) / 20.0f;
		}
	}

	if (n_gs_subroutine == 0)
	{
		gs_modifier[3] = float(n_gs_id + 1) * 0.425f;
	}
	else
	{
		gs_modifier[3] = float(n_gs_id + 1) * 0.0425f;
	}

	if (n_tc_subroutine == 0)
	{
		tc_modifier[1] = float(n_tc_id + 1) * 0.25f;
	}
	else
	{
		tc_modifier[1] = float(n_tc_id + 1) * 0.025f;
	}

	if (n_te_subroutine == 0)
	{
		te_modifier[2] = float(n_te_id + 1) * 0.325f;
	}
	else
	{
		te_modifier[2] = float(n_te_id + 1) * 0.0325f;
	}

	if (n_vs_subroutine == 0)
	{
		vs_modifier[0] = float(n_vs_id + 1) * 0.125f;
	}
	else
	{
		vs_modifier[0] = float(n_vs_id + 1) * 0.0125f;
	}

	/* Determine the expected color */
	for (unsigned int n_component = 0; n_component < 4 /* rgba */; ++n_component)
	{
		expected_color[n_component] = fs_modifier[n_component] + gs_modifier[n_component] + tc_modifier[n_component] +
									  te_modifier[n_component] + vs_modifier[n_component];
	}

	/* Verify all read texels are valid */
	const float epsilon			= 1e-5f;
	bool		should_continue = true;

	for (unsigned int y = 0; y < m_to_height && should_continue; ++y)
	{
		const float* row_ptr = (const float*)m_read_buffer + y * m_to_width * 4; /* rgba */

		for (unsigned int x = 0; x < m_to_width && should_continue; ++x)
		{
			const float* texel_ptr = row_ptr + x * 4; /* rgba */

			if (de::abs(texel_ptr[0] - expected_color[0]) > epsilon ||
				de::abs(texel_ptr[1] - expected_color[1]) > epsilon ||
				de::abs(texel_ptr[2] - expected_color[2]) > epsilon ||
				de::abs(texel_ptr[3] - expected_color[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel rendered at (" << x << ", " << y
								   << ") for "
									  "the following configuration: "
									  "n_fs_id:"
								   << n_fs_id << " n_fs_subroutine:" << n_fs_subroutine << " n_gs_id:" << n_gs_id
								   << " n_gs_subroutine:" << n_gs_subroutine << " n_tc_id:" << n_tc_id
								   << " n_tc_subroutine:" << n_tc_subroutine << " n_te_id:" << n_te_id
								   << " n_te_subroutine:" << n_te_subroutine << " n_vs_id:" << n_vs_id
								   << " n_vs_subroutine:" << n_vs_subroutine << "; expected:"
																				"("
								   << expected_color[0] << ", " << expected_color[1] << ", " << expected_color[2]
								   << ", " << expected_color[3] << "), found:"
																   "("
								   << texel_ptr[0] << ", " << texel_ptr[1] << ", " << texel_ptr[2] << ", "
								   << texel_ptr[3] << ")." << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
				should_continue   = false;
			}
		} /* for (all columns) */
	}	 /* for (all rows) */
}